

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O1

Sentinel __thiscall
chaiscript::boxed_cast<std::shared_ptr<TestBaseType>&>
          (chaiscript *this,Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  element_type *peVar1;
  type_info *ptVar2;
  type_info *ptVar3;
  bool bVar4;
  shared_ptr<TestBaseType> *psVar5;
  undefined8 *puVar6;
  Data *extraout_RDX;
  Data *extraout_RDX_00;
  Data *extraout_RDX_01;
  reference_wrapper<chaiscript::Boxed_Value::Data> rVar7;
  Sentinel SVar8;
  undefined1 local_78 [24];
  pointer_____offset_0x10___ *local_60;
  pointer_____offset_0x10___ *local_58;
  undefined4 local_50;
  
  if (t_conversions != (Type_Conversions_State *)0x0) {
    local_78._0_8_ = &std::shared_ptr<TestBaseType>::typeinfo;
    local_78._8_8_ = &TestBaseType::typeinfo;
    local_78._16_8_ = local_78._16_8_ & 0xffffffff00000000;
    bVar4 = Type_Info::bare_equal
                      (&((bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,(Type_Info *)local_78);
    if (!bVar4) {
      bVar4 = Type_Conversions::convertable_type<std::shared_ptr<TestBaseType>&>
                        ((t_conversions->m_conversions)._M_data);
      if (bVar4) {
        if (t_conversions == (Type_Conversions_State *)0x0) {
LAB_0016179a:
          puVar6 = (undefined8 *)__cxa_allocate_exception(0x38);
          peVar1 = (bv->m_data).
                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_78._16_4_ = (peVar1->m_type_info).m_flags;
          local_78._20_4_ = *(undefined4 *)&(peVar1->m_type_info).field_0x14;
          ptVar2 = (peVar1->m_type_info).m_type_info;
          ptVar3 = (peVar1->m_type_info).m_bare_type_info;
          *puVar6 = &PTR__bad_cast_00176aa0;
          local_78._0_4_ = SUB84(ptVar2,0);
          local_78._4_4_ = (undefined4)((ulong)ptVar2 >> 0x20);
          local_78._8_4_ = SUB84(ptVar3,0);
          local_78._12_4_ = (undefined4)((ulong)ptVar3 >> 0x20);
          *(undefined4 *)(puVar6 + 1) = local_78._0_4_;
          *(undefined4 *)((long)puVar6 + 0xc) = local_78._4_4_;
          *(undefined4 *)(puVar6 + 2) = local_78._8_4_;
          *(undefined4 *)((long)puVar6 + 0x14) = local_78._12_4_;
          puVar6[3] = local_78._16_8_;
          puVar6[4] = &std::shared_ptr<TestBaseType>::typeinfo;
          puVar6[5] = 0x19;
          puVar6[6] = "Cannot perform boxed_cast";
          local_78._0_8_ = ptVar2;
          local_78._8_8_ = ptVar3;
          __cxa_throw(puVar6,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
        }
        bVar4 = Type_Conversions::convertable_type<std::shared_ptr<TestBaseType>&>
                          ((t_conversions->m_conversions)._M_data);
        if (!bVar4) goto LAB_0016179a;
        local_60 = &std::shared_ptr<TestBaseType>::typeinfo;
        local_58 = &TestBaseType::typeinfo;
        local_50 = 0;
        Type_Conversions::boxed_type_conversion
                  ((Type_Conversions *)local_78,(Type_Info *)(t_conversions->m_conversions)._M_data,
                   (Conversion_Saves *)&local_60,(Boxed_Value *)(t_conversions->m_saves)._M_data);
        psVar5 = detail::Any::cast<std::shared_ptr<TestBaseType>>((Any *)(local_78._0_8_ + 0x18));
        *(shared_ptr<TestBaseType> **)this = psVar5;
        *(undefined8 *)(this + 8) = local_78._0_8_;
        rVar7._M_data = extraout_RDX;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
          rVar7._M_data = extraout_RDX_00;
        }
        goto LAB_00161788;
      }
    }
  }
  psVar5 = detail::Any::cast<std::shared_ptr<TestBaseType>>
                     (&((bv->m_data).
                        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->m_obj);
  peVar1 = (bv->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(shared_ptr<TestBaseType> **)this = psVar5;
  *(element_type **)(this + 8) = peVar1;
  rVar7._M_data = extraout_RDX_01;
LAB_00161788:
  SVar8.m_data._M_data = rVar7._M_data;
  SVar8.m_ptr._M_data = (shared_ptr<TestBaseType> *)this;
  return SVar8;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }